

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O1

void cmInstallGenerator::AddTweak
               (ostream *os,Indent indent,string *config,string *dir,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,TweakMethod *tweak)

{
  ostream *poVar1;
  Indent IVar2;
  pointer pbVar3;
  int iVar4;
  int iVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string tws;
  ostringstream tw;
  string local_238;
  string local_218;
  string local_1f8;
  pointer local_1d8;
  string *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [16];
  size_type local_198;
  pointer local_190;
  ios_base local_138 [264];
  
  pbVar3 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 == 0x20) {
    local_1a8._8_8_ = (dir->_M_dataplus)._M_p;
    local_1a8._0_8_ = dir->_M_string_length;
    local_190 = (pbVar3->_M_dataplus)._M_p;
    local_198 = pbVar3->_M_string_length;
    views._M_len = 2;
    views._M_array = (iterator)local_1a8;
    cmCatViews_abi_cxx11_(&local_218,views);
    GetDestDirPath(&local_238,&local_218);
    AddTweak(os,indent,config,&local_238,tweak);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"${file}","");
    AddTweak((ostream *)local_1a8,(Indent)(indent.Level + 2),config,&local_238,tweak);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    if (local_218._M_string_length != 0) {
      IVar2.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar2.Level = IVar2.Level + -1;
        } while (IVar2.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"foreach(file\n",0xd);
      iVar5 = indent.Level + 4;
      pbVar3 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1d8 = (files->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      local_1d0 = dir;
      if (pbVar3 != local_1d8) {
        do {
          iVar4 = iVar5;
          if (-4 < indent.Level) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
          local_238._M_string_length = (size_type)(local_1d0->_M_dataplus)._M_p;
          local_238._M_dataplus._M_p = (pointer)local_1d0->_M_string_length;
          local_238.field_2._8_8_ = (pbVar3->_M_dataplus)._M_p;
          local_238.field_2._M_allocated_capacity = pbVar3->_M_string_length;
          views_00._M_len = 2;
          views_00._M_array = (iterator)&local_238;
          cmCatViews_abi_cxx11_(&local_1c8,views_00);
          GetDestDirPath(&local_1f8,&local_1c8);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          pbVar3 = pbVar3 + 1;
        } while (pbVar3 != local_1d8);
      }
      if (-4 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_218._M_dataplus._M_p,local_218._M_string_length);
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          indent.Level = indent.Level + -1;
        } while (indent.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endforeach()\n",0xd);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void cmInstallGenerator::AddTweak(std::ostream& os, Indent indent,
                                  const std::string& config,
                                  std::string const& dir,
                                  std::vector<std::string> const& files,
                                  const TweakMethod& tweak)
{
  if (files.size() == 1) {
    // Tweak a single file.
    AddTweak(os, indent, config, GetDestDirPath(cmStrCat(dir, files[0])),
             tweak);
  } else {
    // Generate a foreach loop to tweak multiple files.
    std::ostringstream tw;
    AddTweak(tw, indent.Next(), config, "${file}", tweak);
    std::string tws = tw.str();
    if (!tws.empty()) {
      Indent indent2 = indent.Next().Next();
      os << indent << "foreach(file\n";
      for (std::string const& f : files) {
        os << indent2 << "\"" << GetDestDirPath(cmStrCat(dir, f)) << "\"\n";
      }
      os << indent2 << ")\n";
      os << tws;
      os << indent << "endforeach()\n";
    }
  }
}